

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkproxy.cpp
# Opt level: O0

QString * __thiscall QNetworkProxy::password(QNetworkProxy *this)

{
  bool bVar1;
  QString *in_RDI;
  QString *this_00;
  
  this_00 = in_RDI;
  bVar1 = ::QSharedDataPointer::operator_cast_to_bool
                    ((QSharedDataPointer<QNetworkProxyPrivate> *)0x24ac6d);
  if (bVar1) {
    QSharedDataPointer<QNetworkProxyPrivate>::operator->
              ((QSharedDataPointer<QNetworkProxyPrivate> *)0x24ac7d);
    QString::QString(this_00,in_RDI);
  }
  else {
    QString::QString((QString *)0x24ac98);
  }
  return this_00;
}

Assistant:

QString QNetworkProxy::password() const
{
    return d ? d->password : QString();
}